

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_encoder.h
# Opt level: O0

_Bool rc_encode(lzma_range_encoder *rc,uint8_t *out,size_t *out_pos,size_t out_size)

{
  ushort uVar1;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  uint32_t bound;
  probability prob_1;
  probability prob;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_range_encoder *rc_local;
  
  if (0x3a < rc->count) {
    __assert_fail("rc->count <= RC_SYMBOLS_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/rangecoder/range_encoder.h"
                  ,0x9a,"_Bool rc_encode(lzma_range_encoder *, uint8_t *, size_t *, size_t)");
  }
  do {
    if (rc->count <= rc->pos) {
      rc->count = 0;
      rc->pos = 0;
      return false;
    }
    if (rc->range < 0x1000000) {
      _Var2 = rc_shift_low(rc,out,out_pos,out_size);
      if (_Var2) {
        return true;
      }
      rc->range = rc->range << 8;
    }
    switch(rc->symbols[rc->pos]) {
    case RC_BIT_0:
      uVar1 = *rc->probs[rc->pos];
      rc->range = (rc->range >> 0xb) * (uint)uVar1;
      *rc->probs[rc->pos] = uVar1 + (short)(0x800 - uVar1 >> 5);
      break;
    case RC_BIT_1:
      uVar1 = *rc->probs[rc->pos];
      uVar3 = (uint)uVar1 * (rc->range >> 0xb);
      rc->low = (ulong)uVar3 + rc->low;
      rc->range = rc->range - uVar3;
      *rc->probs[rc->pos] = uVar1 - (short)((int)(uint)uVar1 >> 5);
      break;
    case RC_DIRECT_0:
      rc->range = rc->range >> 1;
      break;
    case RC_DIRECT_1:
      rc->range = rc->range >> 1;
      rc->low = (ulong)rc->range + rc->low;
      break;
    case RC_FLUSH:
      rc->range = 0xffffffff;
      do {
        _Var2 = rc_shift_low(rc,out,out_pos,out_size);
        if (_Var2) {
          return true;
        }
        uVar4 = rc->pos + 1;
        rc->pos = uVar4;
      } while (uVar4 < rc->count);
      rc_reset(rc);
      return false;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/rangecoder/range_encoder.h"
                    ,0xd4,"_Bool rc_encode(lzma_range_encoder *, uint8_t *, size_t *, size_t)");
    }
    rc->pos = rc->pos + 1;
  } while( true );
}

Assistant:

static inline bool
rc_encode(lzma_range_encoder *rc,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	assert(rc->count <= RC_SYMBOLS_MAX);

	while (rc->pos < rc->count) {
		// Normalize
		if (rc->range < RC_TOP_VALUE) {
			if (rc_shift_low(rc, out, out_pos, out_size))
				return true;

			rc->range <<= RC_SHIFT_BITS;
		}

		// Encode a bit
		switch (rc->symbols[rc->pos]) {
		case RC_BIT_0: {
			probability prob = *rc->probs[rc->pos];
			rc->range = (rc->range >> RC_BIT_MODEL_TOTAL_BITS)
					* prob;
			prob += (RC_BIT_MODEL_TOTAL - prob) >> RC_MOVE_BITS;
			*rc->probs[rc->pos] = prob;
			break;
		}

		case RC_BIT_1: {
			probability prob = *rc->probs[rc->pos];
			const uint32_t bound = prob * (rc->range
					>> RC_BIT_MODEL_TOTAL_BITS);
			rc->low += bound;
			rc->range -= bound;
			prob -= prob >> RC_MOVE_BITS;
			*rc->probs[rc->pos] = prob;
			break;
		}

		case RC_DIRECT_0:
			rc->range >>= 1;
			break;

		case RC_DIRECT_1:
			rc->range >>= 1;
			rc->low += rc->range;
			break;

		case RC_FLUSH:
			// Prevent further normalizations.
			rc->range = UINT32_MAX;

			// Flush the last five bytes (see rc_flush()).
			do {
				if (rc_shift_low(rc, out, out_pos, out_size))
					return true;
			} while (++rc->pos < rc->count);

			// Reset the range encoder so we are ready to continue
			// encoding if we weren't finishing the stream.
			rc_reset(rc);
			return false;

		default:
			assert(0);
			break;
		}

		++rc->pos;
	}

	rc->count = 0;
	rc->pos = 0;

	return false;
}